

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  pointer peVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer peVar4;
  string entryType;
  entry it;
  char *local_a0;
  char *local_98;
  char local_90 [16];
  ostream *local_80;
  char *local_78;
  long local_70;
  char local_68 [16];
  int64_t local_58;
  entry_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_80 = out;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  peVar4 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar4 != peVar1) {
    do {
      pcVar2 = (peVar4->word)._M_dataplus._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (peVar4->word)._M_string_length);
      local_50 = peVar4->type;
      local_58 = peVar4->count;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,&peVar4->subwords);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"word","");
      if (local_50 == label) {
        std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x129171);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_80,local_78,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_a0,(long)local_98);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      peVar4 = peVar4 + 1;
    } while (peVar4 != peVar1);
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (auto it : words_) {
    std::string entryType = "word";
    if (it.type == entry_type::label) {
      entryType = "label";
    }
    out << it.word << " " << it.count << " " << entryType << std::endl;
  }
}